

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Numbering.hpp
# Opt level: O2

ostream * Lib::operator<<(ostream *out,Numbering<Kernel::Literal_*,_1U> *self)

{
  ostream *poVar1;
  uint i;
  ulong uVar2;
  
  std::operator<<(out,"{");
  if (1 < self->_nextNum) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    poVar1 = std::operator<<(poVar1," -> ");
    Numbering<Kernel::Literal_*,_1U>::obj(self,1);
    std::ostream::_M_insert<void_const*>(poVar1);
    for (uVar2 = 2; uVar2 < self->_nextNum; uVar2 = uVar2 + 1) {
      poVar1 = std::operator<<(out,", ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," -> ");
      Numbering<Kernel::Literal_*,_1U>::obj(self,(uint)uVar2);
      std::ostream::_M_insert<void_const*>(poVar1);
    }
  }
  poVar1 = std::operator<<(out,"}");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Numbering const& self)
  { 
    out << "{";
    if (Start < self._nextNum) {
      out << Start << " -> " << self.obj(Start);
      for (unsigned i = Start + 1; i < self._nextNum; i++) {
        out << ", " << i << " -> " << self.obj(i);
      }
    }
    return out << "}";
  }